

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O3

int run_test_pipe_getsockname(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uint __fd;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int in_ESI;
  uv_loop_t *puVar3;
  uv_pipe_t *in_RDI;
  uv_pipe_t *loop;
  uv_pipe_t *unaff_R14;
  size_t len;
  char buf [1024];
  size_t sStack_cd8;
  undefined1 auStack_cce [20];
  undefined8 uStack_cba;
  undefined8 uStack_cb2;
  undefined8 uStack_caa;
  undefined8 uStack_ca2;
  undefined8 uStack_c9a;
  undefined8 uStack_c92;
  undefined8 uStack_c8a;
  undefined8 uStack_c82;
  undefined8 uStack_c7a;
  undefined8 uStack_c72;
  undefined8 uStack_c6a;
  undefined2 uStack_c62;
  undefined3 uStack_c60;
  undefined5 uStack_c5d;
  undefined3 uStack_c58;
  uv_loop_t *puStack_858;
  uv_loop_t *puStack_850;
  undefined8 uStack_840;
  uv_loop_t uStack_838;
  uv_loop_t *puStack_438;
  code *pcStack_430;
  undefined8 local_420;
  uv_loop_t local_418;
  
  pcStack_430 = (code *)0x162d9b;
  puVar2 = uv_default_loop();
  if (puVar2 == (uv_loop_t *)0x0) {
    pcStack_430 = (code *)0x163041;
    run_test_pipe_getsockname_cold_22();
LAB_00163041:
    pcStack_430 = (code *)0x163046;
    run_test_pipe_getsockname_cold_1();
LAB_00163046:
    pcStack_430 = (code *)0x16304b;
    run_test_pipe_getsockname_cold_2();
LAB_0016304b:
    pcStack_430 = (code *)0x163050;
    run_test_pipe_getsockname_cold_3();
LAB_00163050:
    pcStack_430 = (code *)0x163055;
    run_test_pipe_getsockname_cold_4();
LAB_00163055:
    pcStack_430 = (code *)0x16305a;
    run_test_pipe_getsockname_cold_5();
LAB_0016305a:
    pcStack_430 = (code *)0x16305f;
    run_test_pipe_getsockname_cold_21();
LAB_0016305f:
    pcStack_430 = (code *)0x163064;
    run_test_pipe_getsockname_cold_6();
LAB_00163064:
    pcStack_430 = (code *)0x163069;
    run_test_pipe_getsockname_cold_7();
LAB_00163069:
    pcStack_430 = (code *)0x16306e;
    run_test_pipe_getsockname_cold_8();
LAB_0016306e:
    pcStack_430 = (code *)0x163073;
    run_test_pipe_getsockname_cold_9();
LAB_00163073:
    pcStack_430 = (code *)0x163078;
    run_test_pipe_getsockname_cold_10();
LAB_00163078:
    pcStack_430 = (code *)0x16307d;
    run_test_pipe_getsockname_cold_11();
LAB_0016307d:
    pcStack_430 = (code *)0x163082;
    run_test_pipe_getsockname_cold_12();
LAB_00163082:
    pcStack_430 = (code *)0x163087;
    run_test_pipe_getsockname_cold_13();
LAB_00163087:
    pcStack_430 = (code *)0x16308c;
    run_test_pipe_getsockname_cold_14();
LAB_0016308c:
    pcStack_430 = (code *)0x163091;
    run_test_pipe_getsockname_cold_20();
LAB_00163091:
    pcStack_430 = (code *)0x163096;
    run_test_pipe_getsockname_cold_15();
LAB_00163096:
    pcStack_430 = (code *)0x16309b;
    run_test_pipe_getsockname_cold_16();
LAB_0016309b:
    pcStack_430 = (code *)0x1630a0;
    run_test_pipe_getsockname_cold_17();
LAB_001630a0:
    pcStack_430 = (code *)0x1630a5;
    run_test_pipe_getsockname_cold_18();
  }
  else {
    in_ESI = 0x3287b8;
    pcStack_430 = (code *)0x162db8;
    in_RDI = (uv_pipe_t *)puVar2;
    iVar1 = uv_pipe_init(puVar2,&pipe_server,0);
    unaff_RBX = puVar2;
    if (iVar1 != 0) goto LAB_00163041;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162ddd;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_00163046;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162e03;
    iVar1 = uv_pipe_getpeername(&pipe_server,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_0016304b;
    in_RDI = &pipe_server;
    in_ESI = 0x18e322;
    pcStack_430 = (code *)0x162e1f;
    iVar1 = uv_pipe_bind(&pipe_server,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00163050;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    unaff_R14 = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x162e47;
    puVar3 = (uv_loop_t *)unaff_R14;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)unaff_R14,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != 0) goto LAB_00163055;
    if (*(char *)((long)((uv_loop_t *)unaff_R14)->handle_queue + (local_420 - 0x11)) == '\0')
    goto LAB_0016305a;
    if (*(char *)((long)local_418.handle_queue + (local_420 - 0x10)) != '\0') goto LAB_0016305f;
    in_ESI = 0x18e322;
    in_RDI = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x162e7c;
    iVar1 = bcmp(in_RDI,"/tmp/uv-test-sock",local_420);
    if (iVar1 != 0) goto LAB_00163064;
    local_420 = 0x400;
    in_RDI = &pipe_server;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162ea1;
    iVar1 = uv_pipe_getpeername(&pipe_server,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -0x6b) goto LAB_00163069;
    in_RDI = &pipe_server;
    in_ESI = 0;
    pcStack_430 = (code *)0x162ebf;
    iVar1 = uv_listen((uv_stream_t *)&pipe_server,0,pipe_server_connection_cb);
    if (iVar1 != 0) goto LAB_0016306e;
    in_ESI = 0x3288c0;
    pcStack_430 = (code *)0x162ed8;
    in_RDI = (uv_pipe_t *)puVar2;
    iVar1 = uv_pipe_init(puVar2,&pipe_client,0);
    if (iVar1 != 0) goto LAB_00163073;
    local_420 = 0x400;
    in_RDI = &pipe_client;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162efd;
    iVar1 = uv_pipe_getsockname(&pipe_client,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_00163078;
    local_420 = 0x400;
    in_RDI = &pipe_client;
    puVar3 = &local_418;
    pcStack_430 = (code *)0x162f23;
    iVar1 = uv_pipe_getpeername(&pipe_client,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != -9) goto LAB_0016307d;
    unaff_R14 = &pipe_client;
    pcStack_430 = (code *)0x162f50;
    uv_pipe_connect(&connect_req,&pipe_client,"/tmp/uv-test-sock",pipe_client_connect_cb);
    local_420 = 0x400;
    puVar3 = &local_418;
    in_RDI = &pipe_client;
    pcStack_430 = (code *)0x162f69;
    iVar1 = uv_pipe_getsockname(&pipe_client,(char *)puVar3,&local_420);
    in_ESI = (int)puVar3;
    if ((iVar1 != 0) || (local_420 != 0)) goto LAB_00163082;
    local_420 = 0x400;
    in_RDI = &pipe_client;
    unaff_R14 = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x162f9d;
    puVar3 = (uv_loop_t *)unaff_R14;
    iVar1 = uv_pipe_getpeername(&pipe_client,(char *)unaff_R14,&local_420);
    in_ESI = (int)puVar3;
    if (iVar1 != 0) goto LAB_00163087;
    if (*(char *)((long)((uv_loop_t *)unaff_R14)->handle_queue + (local_420 - 0x11)) == '\0')
    goto LAB_0016308c;
    in_ESI = 0x18e322;
    in_RDI = (uv_pipe_t *)&local_418;
    pcStack_430 = (code *)0x162fc7;
    iVar1 = bcmp(in_RDI,"/tmp/uv-test-sock",local_420);
    if (iVar1 != 0) goto LAB_00163091;
    in_ESI = 0;
    pcStack_430 = (code *)0x162fd9;
    in_RDI = (uv_pipe_t *)puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00163096;
    if (pipe_client_connect_cb_called != 1) goto LAB_0016309b;
    if (pipe_close_cb_called != 2) goto LAB_001630a0;
    pcStack_430 = (code *)0x163000;
    unaff_RBX = uv_default_loop();
    pcStack_430 = (code *)0x163014;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    in_ESI = 0;
    pcStack_430 = (code *)0x16301e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_430 = (code *)0x163023;
    in_RDI = (uv_pipe_t *)uv_default_loop();
    pcStack_430 = (code *)0x16302b;
    iVar1 = uv_loop_close((uv_loop_t *)in_RDI);
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_430 = pipe_server_connection_cb;
  run_test_pipe_getsockname_cold_19();
  if (in_ESI == 0) {
    return extraout_EAX;
  }
  puStack_438 = (uv_loop_t *)pipe_client_connect_cb;
  pipe_server_connection_cb_cold_1();
  puStack_438 = unaff_RBX;
  if (in_RDI == (uv_pipe_t *)&connect_req) {
    if (in_ESI != 0) goto LAB_00163184;
    uStack_840 = 0x400;
    puStack_850 = (uv_loop_t *)0x1630f5;
    iVar1 = uv_pipe_getpeername(&pipe_client,(char *)&uStack_838,&uStack_840);
    unaff_RBX = &uStack_838;
    if (iVar1 != 0) goto LAB_00163189;
    if (*(char *)((long)uStack_838.handle_queue + (uStack_840 - 0x11)) == '\0') goto LAB_0016318e;
    puStack_850 = (uv_loop_t *)0x16311e;
    iVar1 = bcmp(&uStack_838,"/tmp/uv-test-sock",uStack_840);
    if (iVar1 != 0) goto LAB_00163193;
    uStack_840 = 0x400;
    puStack_850 = (uv_loop_t *)0x16313f;
    iVar1 = uv_pipe_getsockname(&pipe_client,(char *)&uStack_838,&uStack_840);
    if ((iVar1 == 0) && (uStack_840 == 0)) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      puStack_850 = (uv_loop_t *)0x163167;
      uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
      puStack_850 = (uv_loop_t *)0x163176;
      uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
      return extraout_EAX_00;
    }
  }
  else {
    puStack_850 = (uv_loop_t *)0x163184;
    pipe_client_connect_cb_cold_1();
LAB_00163184:
    puStack_850 = (uv_loop_t *)0x163189;
    pipe_client_connect_cb_cold_2();
LAB_00163189:
    puStack_850 = (uv_loop_t *)0x16318e;
    pipe_client_connect_cb_cold_3();
LAB_0016318e:
    puStack_850 = (uv_loop_t *)0x163193;
    pipe_client_connect_cb_cold_6();
LAB_00163193:
    puStack_850 = (uv_loop_t *)0x163198;
    pipe_client_connect_cb_cold_4();
  }
  puStack_850 = (uv_loop_t *)run_test_pipe_getsockname_abstract;
  pipe_client_connect_cb_cold_5();
  loop = (uv_pipe_t *)0x1;
  puStack_858 = unaff_RBX;
  puStack_850 = (uv_loop_t *)unaff_R14;
  __fd = socket(1,1,0);
  if (__fd == 0xffffffff) {
    run_test_pipe_getsockname_abstract_cold_8();
LAB_0016330e:
    run_test_pipe_getsockname_abstract_cold_1();
LAB_00163313:
    run_test_pipe_getsockname_abstract_cold_2();
LAB_00163318:
    run_test_pipe_getsockname_abstract_cold_3();
LAB_0016331d:
    run_test_pipe_getsockname_abstract_cold_4();
LAB_00163322:
    run_test_pipe_getsockname_abstract_cold_5();
  }
  else {
    auStack_cce._13_7_ = 0;
    uStack_cba = 0;
    uStack_c72 = 0;
    uStack_c6a = 0;
    uStack_c82 = 0;
    uStack_c7a = 0;
    uStack_c92 = 0;
    uStack_c8a = 0;
    uStack_ca2 = 0;
    uStack_c9a = 0;
    uStack_cb2 = 0;
    uStack_caa = 0;
    uStack_c62 = 0;
    auStack_cce._0_2_ = 1;
    auStack_cce[2] = '\0';
    auStack_cce[3] = 't';
    auStack_cce[4] = 'e';
    auStack_cce[5] = 's';
    auStack_cce[6] = 't';
    auStack_cce[7] = '-';
    auStack_cce[8] = 'p';
    auStack_cce[9] = 'i';
    auStack_cce[10] = 'p';
    auStack_cce[0xb] = 'e';
    auStack_cce[0xc] = '\0';
    loop = (uv_pipe_t *)(ulong)__fd;
    iVar1 = bind(__fd,(sockaddr *)auStack_cce,0x6e);
    if (iVar1 != 0) goto LAB_0016330e;
    loop = (uv_pipe_t *)uv_default_loop();
    iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_server,0);
    if (iVar1 != 0) goto LAB_00163313;
    loop = &pipe_server;
    iVar1 = uv_pipe_open(&pipe_server,__fd);
    if (iVar1 != 0) goto LAB_00163318;
    sStack_cd8 = 0x400;
    loop = &pipe_server;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&uStack_c60,&sStack_cd8);
    if (iVar1 != 0) goto LAB_0016331d;
    if (CONCAT35(uStack_c58,uStack_c5d) != 0x657069702d7473 ||
        CONCAT53(uStack_c5d,uStack_c60) != 0x69702d7473657400) goto LAB_00163322;
    uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_pipe_t *)(ulong)__fd;
    close(__fd);
    if (pipe_close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016332c;
    }
  }
  run_test_pipe_getsockname_abstract_cold_6();
LAB_0016332c:
  run_test_pipe_getsockname_abstract_cold_7();
  if (loop == &pipe_server || loop == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)CONCAT71(0x3288,loop == &pipe_client);
  }
  pipe_close_cb_cold_1();
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(pipe_getsockname) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_loop_t* loop;
  char buf[1024];
  size_t len;
  int r;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  r = uv_pipe_init(loop, &pipe_server, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_bind(&pipe_server, TEST_PIPENAME);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(buf[len] == '\0');
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_server, buf, &len);
  ASSERT(r == UV_ENOTCONN);

  r = uv_listen((uv_stream_t*) &pipe_server, 0, pipe_server_connection_cb);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &pipe_client, 0);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == UV_EBADF);

  uv_pipe_connect(&connect_req, &pipe_client, TEST_PIPENAME, pipe_client_connect_cb);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(pipe_client_connect_cb_called == 1);
  ASSERT(pipe_close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}